

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O3

void __thiscall
Model_removeImportedUnitsByName_Test::TestBody(Model_removeImportedUnitsByName_Test *this)

{
  string *psVar1;
  char cVar2;
  char *pcVar3;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ModelPtr model;
  long *local_60;
  long *local_58;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48 [8];
  AssertionResult local_40;
  long local_30 [2];
  string *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  commonSetupImportedUnits();
  psVar1 = local_20;
  local_40._0_8_ = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"myConcreteUnits","");
  cVar2 = libcellml::Model::removeUnits(psVar1);
  local_58 = (long *)CONCAT71(local_58._1_7_,cVar2);
  local_50.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((long *)local_40._0_8_ == local_30) {
    if (cVar2 == '\0') goto LAB_0011fd43;
  }
  else {
    operator_delete((void *)local_40._0_8_,local_30[0] + 1);
    if (((ulong)local_58 & 1) == 0) {
LAB_0011fd43:
      testing::Message::Message((Message *)&local_60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_40,(char *)&local_58,"model->removeUnits(\"myConcreteUnits\")","false");
      testing::internal::AssertHelper::AssertHelper
                (local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
                 ,0x34c,(char *)local_40._0_8_);
      testing::internal::AssertHelper::operator=(local_48,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(local_48);
      if ((long *)local_40._0_8_ != local_30) {
        operator_delete((void *)local_40._0_8_,local_30[0] + 1);
      }
      if (((local_60 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
         (local_60 != (long *)0x0)) {
        (**(code **)(*local_60 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_40._0_8_ = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"myImportedUnits","");
  cVar2 = libcellml::Model::removeUnits(local_20);
  local_58 = (long *)CONCAT71(local_58._1_7_,cVar2);
  local_50.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((long *)local_40._0_8_ == local_30) {
    if (cVar2 != '\0') goto LAB_0011fefc;
  }
  else {
    operator_delete((void *)local_40._0_8_,local_30[0] + 1);
    if (((ulong)local_58 & 1) != 0) goto LAB_0011fefc;
  }
  testing::Message::Message((Message *)&local_60);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_40,(char *)&local_58,"model->removeUnits(\"myImportedUnits\")","false");
  testing::internal::AssertHelper::AssertHelper
            (local_48,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
             ,0x34d,(char *)local_40._0_8_);
  testing::internal::AssertHelper::operator=(local_48,(Message *)&local_60);
  testing::internal::AssertHelper::~AssertHelper(local_48);
  if ((long *)local_40._0_8_ != local_30) {
    operator_delete((void *)local_40._0_8_,local_30[0] + 1);
  }
  if (((local_60 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
     (local_60 != (long *)0x0)) {
    (**(code **)(*local_60 + 8))();
  }
LAB_0011fefc:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58 = (long *)0x0;
  local_60 = (long *)libcellml::Model::unitsCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_40,"size_t(0)","model->unitsCount()",(unsigned_long *)&local_58,
             (unsigned_long *)&local_60);
  if ((string)local_40.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_40.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x34f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
    if (((local_58 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
       (local_58 != (long *)0x0)) {
      (**(code **)(*local_58 + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

TEST(Model, removeImportedUnitsByName)
{
    auto model = commonSetupImportedUnits();

    EXPECT_TRUE(model->removeUnits("myConcreteUnits"));
    EXPECT_TRUE(model->removeUnits("myImportedUnits"));

    EXPECT_EQ(size_t(0), model->unitsCount());
}